

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screrror.cpp
# Opt level: O2

HRESULT MapHr(HRESULT hr,ErrorTypeEnum *errorTypeOut)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  HRESULT HVar4;
  undefined4 *puVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  if (MapHr(int,ErrorTypeEnum*)::fCheckSort == '\0') {
    MapHr(int,ErrorTypeEnum*)::fCheckSort = '\x01';
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    for (lVar8 = 0xc; lVar8 != 0x228; lVar8 = lVar8 + 0xc) {
      if (*(uint *)((long)&g_rgmhr[0].hrIn + lVar8) <= *(uint *)(&UNK_010016c4 + lVar8)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/screrror.cpp"
                           ,0x8e,"((uint32)g_rgmhr[imhr - 1].hrIn < (uint32)g_rgmhr[imhr].hrIn)",
                           "(uint32)g_rgmhr[imhr - 1].hrIn < (uint32)g_rgmhr[imhr].hrIn");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
    }
  }
  if (errorTypeOut != (ErrorTypeEnum *)0x0) {
    *errorTypeOut = kjstError;
  }
  HVar4 = 0;
  if ((hr < 0) && (HVar4 = hr, (hr & 0x1fff0000U) != 0xa0000)) {
    iVar6 = 0;
    iVar3 = 0x2e;
    while (iVar7 = iVar3, iVar6 < iVar7) {
      iVar3 = (iVar7 + iVar6) / 2;
      if ((uint)g_rgmhr[iVar3].hrIn < (uint)hr) {
        iVar6 = iVar3 + 1;
        iVar3 = iVar7;
      }
    }
    if ((iVar6 < 0x2e) && (g_rgmhr[iVar6].hrIn == hr)) {
      if (errorTypeOut != (ErrorTypeEnum *)0x0) {
        *errorTypeOut = g_rgmhr[iVar6].errorType;
      }
      HVar4 = g_rgmhr[iVar6].hrOut;
    }
  }
  return HVar4;
}

Assistant:

HRESULT MapHr(HRESULT hr, ErrorTypeEnum * errorTypeOut)
{
    int imhrMin, imhrLim, imhr;

#if DEBUG
    // In debug, check that all the entries in the error map table are
    // sorted based on the HRESULT in ascending order. We will then binary
    // search the sorted array. We need do this only once per invocation.
    static BOOL fCheckSort = TRUE;

    if (fCheckSort)
    {
        fCheckSort = FALSE;
        for (imhr = 1; imhr < kcmhr; imhr++)
            Assert((uint32)g_rgmhr[imhr - 1].hrIn < (uint32)g_rgmhr[imhr].hrIn);
    }
#endif // DEBUG

    if (errorTypeOut != nullptr)
    {
        *errorTypeOut = kjstError;
    }

    if (SUCCEEDED(hr))
        return NOERROR;

    if (FACILITY_CONTROL == HRESULT_FACILITY(hr))
        return hr;

    for (imhrMin = 0, imhrLim = kcmhr; imhrMin < imhrLim; )
    {
        imhr = (imhrMin + imhrLim) / 2;
        if ((uint32)g_rgmhr[imhr].hrIn < (uint32)hr)
            imhrMin = imhr + 1;
        else
            imhrLim = imhr;
    }
    if (imhrMin < kcmhr && hr == g_rgmhr[imhrMin].hrIn)
    {
        if (errorTypeOut != nullptr)
        {
            *errorTypeOut = g_rgmhr[imhrMin].errorType;
        }

        return g_rgmhr[imhrMin].hrOut;
    }

    return hr;
}